

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_ppm(opj_j2k_t *j2k)

{
  opj_cp_t *poVar1;
  opj_cio_t *cio;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  poVar1 = j2k->cp;
  cio = j2k->cio;
  uVar2 = cio_read(cio,2);
  poVar1->ppm = 1;
  uVar3 = cio_read(cio,1);
  iVar7 = uVar2 - 3;
  do {
    if (iVar7 < 1) {
      return;
    }
    uVar2 = poVar1->ppm_previous;
    if (uVar2 == 0) {
      uVar2 = cio_read(cio,4);
      iVar7 = iVar7 + -4;
    }
    iVar10 = poVar1->ppm_store;
    if (uVar3 == 0) {
      puVar5 = (uchar *)malloc((long)(int)uVar2);
      poVar1->ppm_data = puVar5;
      poVar1->ppm_data_first = puVar5;
      uVar6 = uVar2;
    }
    else {
      puVar5 = (uchar *)realloc(poVar1->ppm_data,(long)(int)uVar2 + (long)iVar10);
      poVar1->ppm_data = puVar5;
      poVar1->ppm_data_first = puVar5;
      uVar6 = uVar2 + poVar1->ppm_store;
    }
    poVar1->ppm_len = uVar6;
    uVar11 = iVar7 - 1;
    lVar9 = 0;
    for (uVar6 = uVar2; uVar8 = (uint)lVar9, 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      uVar4 = cio_read(cio,1);
      poVar1->ppm_data[lVar9 + iVar10] = (uchar)uVar4;
      if (uVar11 == uVar8) {
        iVar10 = iVar10 + uVar8 + 1;
        iVar7 = 0;
        goto LAB_0011fa41;
      }
      lVar9 = lVar9 + 1;
      iVar7 = iVar7 + -1;
    }
    iVar10 = iVar10 + uVar8;
LAB_0011fa41:
    poVar1->ppm_previous = ~uVar8 + uVar2;
    poVar1->ppm_store = iVar10;
  } while( true );
}

Assistant:

static void j2k_read_ppm(opj_j2k_t *j2k) {
	int len, Z_ppm, i, j;
	int N_ppm;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);
	cp->ppm = 1;
	
	Z_ppm = cio_read(cio, 1);	/* Z_ppm */
	len -= 3;
	while (len > 0) {
		if (cp->ppm_previous == 0) {
			N_ppm = cio_read(cio, 4);	/* N_ppm */
			len -= 4;
		} else {
			N_ppm = cp->ppm_previous;
		}
		j = cp->ppm_store;
		if (Z_ppm == 0) {	/* First PPM marker */
			cp->ppm_data = (unsigned char *) opj_malloc(N_ppm * sizeof(unsigned char));
			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm;
		} else {			/* NON-first PPM marker */
			cp->ppm_data = (unsigned char *) opj_realloc(cp->ppm_data, (N_ppm +	cp->ppm_store) * sizeof(unsigned char));

#ifdef USE_JPWL
			/* this memory allocation check could be done even in non-JPWL cases */
			if (cp->correct) {
				if (!cp->ppm_data) {
					opj_event_msg(j2k->cinfo, EVT_ERROR,
						"JPWL: failed memory allocation during PPM marker parsing (pos. %x)\n",
						cio_tell(cio));
					if (!JPWL_ASSUME || JPWL_ASSUME) {
						opj_free(cp->ppm_data);
						opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return;
					}
				}
			}
#endif

			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm + cp->ppm_store;
		}
		for (i = N_ppm; i > 0; i--) {	/* Read packet header */
			cp->ppm_data[j] = cio_read(cio, 1);
			j++;
			len--;
			if (len == 0)
				break;			/* Case of non-finished packet header in present marker but finished in next one */
		}
		cp->ppm_previous = i - 1;
		cp->ppm_store = j;
	}
}